

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::EnhancedLayouts::XFBStrideOfEmptyListTest::executeDrawCall
          (XFBStrideOfEmptyListTest *this,GLuint test_case_index)

{
  int iVar1;
  deUint32 dVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  TestContext *pTVar4;
  TestLog *pTVar5;
  MessageBuilder *pMVar6;
  Enum<int,_2UL> EVar7;
  Enum<int,_2UL> local_368;
  MessageBuilder local_358;
  GetNameFunc local_1d8;
  int local_1d0;
  Enum<int,_2UL> local_1c8 [2];
  MessageBuilder local_1a8;
  deUint32 local_28;
  byte local_21;
  GLenum error;
  bool result;
  Functions *gl;
  XFBStrideOfEmptyListTest *pXStack_10;
  GLuint test_case_index_local;
  XFBStrideOfEmptyListTest *this_local;
  
  gl._4_4_ = test_case_index;
  pXStack_10 = this;
  pRVar3 = deqp::Context::getRenderContext
                     ((this->super_BufferTestBase).super_TestBase.super_TestCase.m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  _error = CONCAT44(extraout_var,iVar1);
  local_21 = 1;
  (**(code **)(_error + 0x4e8))(0x8c89);
  dVar2 = (**(code **)(_error + 0x800))();
  glu::checkError(dVar2,"Disable",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
                  ,0x4dc8);
  (**(code **)(_error + 0x30))(0);
  local_28 = (**(code **)(_error + 0x800))();
  if (gl._4_4_ == 0) {
    if (local_28 != 0) {
      (**(code **)(_error + 0x638))();
      glu::checkError(local_28,"BeginTransformFeedback",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
                      ,0x4dd2);
    }
    (**(code **)(_error + 0x538))(0xe,0,1);
    local_28 = (**(code **)(_error + 0x800))();
    (**(code **)(_error + 0x638))();
    glu::checkError(local_28,"DrawArrays",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
                    ,0x4dd9);
    dVar2 = (**(code **)(_error + 0x800))();
    glu::checkError(dVar2,"EndTransformFeedback",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
                    ,0x4dda);
  }
  else if (gl._4_4_ == 1) {
    if (local_28 == 0) {
      (**(code **)(_error + 0x638))();
    }
    if (local_28 != 0x502) {
      pTVar4 = deqp::Context::getTestContext
                         ((this->super_BufferTestBase).super_TestBase.super_TestCase.m_context);
      pTVar5 = tcu::TestContext::getLog(pTVar4);
      tcu::TestLog::operator<<(&local_1a8,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar6 = tcu::MessageBuilder::operator<<
                         (&local_1a8,
                          (char (*) [138])
                          "XFB at index 0, that is written by GS, is missing. It was expected that INVALID_OPERATION will generated by BeginTransformFeedback. Got: "
                         );
      EVar7 = glu::getErrorStr(local_28);
      local_1d8 = EVar7.m_getName;
      local_1d0 = EVar7.m_value;
      local_1c8[0].m_getName = local_1d8;
      local_1c8[0].m_value = local_1d0;
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,local_1c8);
      tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_1a8);
      local_21 = 0;
    }
  }
  else if (gl._4_4_ == 2) {
    if (local_28 == 0) {
      (**(code **)(_error + 0x638))();
    }
    if (local_28 != 0x502) {
      pTVar4 = deqp::Context::getTestContext
                         ((this->super_BufferTestBase).super_TestBase.super_TestCase.m_context);
      pTVar5 = tcu::TestContext::getLog(pTVar4);
      tcu::TestLog::operator<<(&local_358,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar6 = tcu::MessageBuilder::operator<<
                         (&local_358,
                          (char (*) [142])
                          "XFB at index 1, that is declared as empty, is missing. It was expected that INVALID_OPERATION will generated by BeginTransformFeedback. Got: "
                         );
      EVar7 = glu::getErrorStr(local_28);
      local_368.m_getName = EVar7.m_getName;
      local_368.m_value = EVar7.m_value;
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_368);
      tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_358);
      local_21 = 0;
    }
  }
  return (bool)(local_21 & 1);
}

Assistant:

bool XFBStrideOfEmptyListTest::executeDrawCall(GLuint test_case_index)
{
	const Functions& gl		= m_context.getRenderContext().getFunctions();
	bool			 result = true;

	/* Draw */
	gl.disable(GL_RASTERIZER_DISCARD);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Disable");

	gl.beginTransformFeedback(GL_POINTS);
	GLenum error = gl.getError();
	switch (test_case_index)
	{
	case VALID:
		if (GL_NO_ERROR != error)
		{
			gl.endTransformFeedback();
			GLU_EXPECT_NO_ERROR(error, "BeginTransformFeedback");
		}

		gl.drawArrays(GL_PATCHES, 0 /* first */, 1 /* count */);
		error = gl.getError();

		gl.endTransformFeedback();
		GLU_EXPECT_NO_ERROR(error, "DrawArrays");
		GLU_EXPECT_NO_ERROR(gl.getError(), "EndTransformFeedback");

		break;

	case FIRST_MISSING:
		if (GL_NO_ERROR == error)
		{
			gl.endTransformFeedback();
		}

		if (GL_INVALID_OPERATION != error)
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message << "XFB at index 0, that is written by GS, is missing. It was expected that "
											"INVALID_OPERATION will generated by BeginTransformFeedback. Got: "
				<< glu::getErrorStr(error) << tcu::TestLog::EndMessage;

			result = false;
		}

		break;

	case SECOND_MISSING:
		if (GL_NO_ERROR == error)
		{
			gl.endTransformFeedback();
		}

		if (GL_INVALID_OPERATION != error)
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message << "XFB at index 1, that is declared as empty, is missing. It was expected "
											"that INVALID_OPERATION will generated by BeginTransformFeedback. Got: "
				<< glu::getErrorStr(error) << tcu::TestLog::EndMessage;

			result = false;
		}

		break;
	}

	/* Done */
	return result;
}